

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_color_hsva_bv(nk_byte *out,nk_color in)

{
  int tmp [4];
  nk_byte local_28 [4];
  nk_byte local_24 [4];
  nk_byte local_20 [4];
  nk_byte local_1c [12];
  
  nk_color_hsva_i((int *)local_28,(int *)local_24,(int *)local_20,(int *)local_1c,in);
  *out = local_28[0];
  out[1] = local_24[0];
  out[2] = local_20[0];
  out[3] = local_1c[0];
  return;
}

Assistant:

NK_API void
nk_color_hsva_bv(nk_byte *out, struct nk_color in)
{
    int tmp[4];
    nk_color_hsva_i(&tmp[0], &tmp[1], &tmp[2], &tmp[3], in);
    out[0] = (nk_byte)tmp[0];
    out[1] = (nk_byte)tmp[1];
    out[2] = (nk_byte)tmp[2];
    out[3] = (nk_byte)tmp[3];
}